

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O2

Qiniu_Error Qiniu_Qetag_Update(_Qiniu_Qetag_Context *ctx,char *buf,size_t bufSize)

{
  Qiniu_Qetag_Block **blk;
  anon_struct_4_3_eb54787e_for__Qiniu_Qetag_Block_0 aVar1;
  ulong uVar2;
  ulong bufSize_00;
  _Qiniu_Qetag_Block *blk_00;
  Qiniu_Error QVar3;
  
  blk = &ctx->blk;
  do {
    if (bufSize == 0) {
      QVar3.message = "ok";
      QVar3._0_8_ = 200;
      return QVar3;
    }
    blk_00 = *blk;
    if (blk_00 == (_Qiniu_Qetag_Block *)0x0) {
      QVar3 = Qiniu_Qetag_allocateBlock(ctx,blk);
      if (QVar3.code != 200) {
        return QVar3;
      }
      blk_00 = *blk;
    }
    aVar1 = blk_00->field_0;
    uVar2 = (ulong)((uint)aVar1 & 0x7fffff);
    bufSize_00 = uVar2;
    if (bufSize < uVar2) {
      bufSize_00 = bufSize;
    }
    if (uVar2 != 0) {
      QVar3 = Qiniu_Qetag_UpdateBlock(blk_00,buf,bufSize_00,(size_t *)0x0);
      if (QVar3.code != 200) {
        return QVar3;
      }
      buf = buf + bufSize_00;
      bufSize = bufSize - bufSize_00;
      blk_00 = *blk;
      aVar1 = blk_00->field_0;
    }
    if (((uint)aVar1 & 0x7fffff) == 0) {
      Qiniu_Qetag_CommitBlock(ctx,blk_00);
      ctx->blk = (Qiniu_Qetag_Block *)0x0;
    }
  } while( true );
}

Assistant:

Qiniu_Error Qiniu_Qetag_Update(struct _Qiniu_Qetag_Context * ctx, const char * buf, size_t bufSize)
{
    Qiniu_Error err;
    const char * pos = buf;
    size_t size = bufSize;
    size_t copySize = 0;

    while (size > 0) {
        if (!ctx->blk) {
            err = Qiniu_Qetag_allocateBlock(ctx, &ctx->blk);
            if (err.code != 200) {
                return err;
            }
        } // if

        copySize = (size >= ctx->blk->capacity) ? ctx->blk->capacity : size;
        if (copySize) {
            err = Qiniu_Qetag_UpdateBlock(ctx->blk, pos, copySize, NULL);
            if (err.code != 200) {
                return err;
            }

            pos += copySize;
            size -= copySize;
        } // if

        if (ctx->blk->capacity == 0) {
            Qiniu_Qetag_CommitBlock(ctx, ctx->blk);
            ctx->blk = NULL;
        } // if
    } // while

    err.code = 200;
    err.message = "ok";
    return err;
}